

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O1

int event_callback_cancel(uint id)

{
  int pi;
  evtCallback_t **ppeVar1;
  evtCallback_t *__ptr;
  
  __ptr = geCallBackFirst;
  if (geCallBackFirst != (evtCallback_t *)0x0) {
    do {
      if (__ptr->id == id) {
        pi = __ptr->pi;
        ppeVar1 = &geCallBackFirst;
        if (__ptr->prev != (evtCallback_t *)0x0) {
          ppeVar1 = &__ptr->prev->next;
        }
        *ppeVar1 = __ptr->next;
        ppeVar1 = &geCallBackLast;
        if (__ptr->next != (evtCallback_t *)0x0) {
          ppeVar1 = &__ptr->next->prev;
        }
        *ppeVar1 = __ptr->prev;
        free(__ptr);
        findEventBits(pi);
        return 0;
      }
      ppeVar1 = &__ptr->next;
      __ptr = *ppeVar1;
    } while (*ppeVar1 != (evtCallback_t *)0x0);
  }
  return -0x7da;
}

Assistant:

int event_callback_cancel(unsigned id)
{
   evtCallback_t *ep;
   int pi;

   ep = geCallBackFirst;

   while (ep)
   {
      if (ep->id == id)
      {
         pi = ep->pi;

         if (ep->prev) {ep->prev->next = ep->next;}
         else          {geCallBackFirst = ep->next;}

         if (ep->next) {ep->next->prev = ep->prev;}
         else          {geCallBackLast = ep->prev;}

         free(ep);

         findEventBits(pi);

         return 0;
      }
      ep = ep->next;
   }
   return pigif_callback_not_found;
}